

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

short __thiscall QByteArray::toShort(QByteArray *this,bool *ok,int base)

{
  short sVar1;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar2;
  bool bVar3;
  QByteArrayView data;
  undefined1 local_38 [16];
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data.m_data._0_4_ = base;
  data.m_size = (qsizetype)(this->d).ptr;
  data.m_data._4_4_ = 0;
  QtPrivate::toSignedInteger
            ((ParsedNumber<long_long> *)local_38,(QtPrivate *)(this->d).size,data,in_R8D);
  bVar2 = (local_38._8_8_ & 1) == 0;
  bVar3 = (undefined1 *)(long)(short)local_38._0_8_ == (undefined1 *)local_38._0_8_;
  if (ok != (bool *)0x0) {
    *ok = bVar3 && bVar2;
  }
  sVar1 = 0;
  if (bVar3 && bVar2) {
    sVar1 = (short)local_38._0_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

short QByteArray::toShort(bool *ok, int base) const
{
    return QtPrivate::toIntegral<short>(qToByteArrayViewIgnoringNull(*this), ok, base);
}